

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::increment_abs(char *ext)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *in_RDI;
  int dig;
  int carry;
  int exp;
  size_t idx;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *local_28;
  char *local_10;
  
  iVar2 = get_exp((char *)0x2c2033);
  if (iVar2 < 1) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = (char *)(long)iVar2;
  }
  local_10 = local_28;
  pcVar4 = (char *)get_prec((char *)0x2c206f);
  if (local_28 <= pcVar4) {
    bVar1 = true;
    while (local_10 != (char *)0x0) {
      local_10 = local_10 + -1;
      uVar3 = get_dig(in_RDI,(size_t)local_10);
      if (uVar3 != 9) {
        set_dig(in_RDI,(size_t)local_10,uVar3 + 1);
        bVar1 = false;
        break;
      }
      set_dig(in_RDI,(size_t)local_10,0);
    }
    if (bVar1) {
      while( true ) {
        uVar3 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
        iVar2 = get_exp((char *)0x2c2105);
        if (-1 < iVar2) break;
        shift_right(local_28,uVar3);
        in_stack_ffffffffffffffc8 = in_RDI;
        get_exp((char *)0x2c212d);
        set_exp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      shift_right(local_28,uVar3);
      pcVar4 = in_RDI;
      get_exp((char *)0x2c2161);
      set_exp(pcVar4,in_stack_ffffffffffffffbc);
      set_dig(in_RDI,0,1);
    }
    in_RDI[4] = in_RDI[4] & 0xf7;
  }
  return;
}

Assistant:

void CVmObjBigNum::increment_abs(char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    int carry;

    /* start at the one's place, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* 
     *   if the units digit is to the right of the number (i.e., the number's
     *   scale is large), there's nothing to do 
     */
    if (idx > get_prec(ext))
        return;

    /* increment digits */
    for (carry = TRUE ; idx != 0 ; )
    {
        int dig;

        /* move to the next digit */
        --idx;

        /* get the digit value */
        dig = get_dig(ext, idx);

        /* increment it, checking for carry */
        if (dig == 9)
        {
            /* increment it to zero and keep going to carry */
            set_dig(ext, idx, 0);
        }
        else
        {
            /* increment this digit */
            set_dig(ext, idx, dig + 1);

            /* there's no carry out */
            carry = FALSE;

            /* done */
            break;
        }
    }

    /* if we carried past the end of the number, insert the leading 1 */
    if (carry)
    {
        /* 
         *   if we still haven't reached the units position, shift right
         *   until we do 
         */
        while (get_exp(ext) < 0)
        {
            /* shift it right and adjust the exponent */
            shift_right(ext, 1);
            set_exp(ext, get_exp(ext) + 1);
        }

        /* shift the number right and adjust the exponent */
        shift_right(ext, 1);
        set_exp(ext, get_exp(ext) + 1);

        /* insert the leading 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is now non-zero */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}